

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_collection.cpp
# Opt level: O0

void __thiscall
FImageCollection::Add(FImageCollection *this,char **patchNames,int numPatches,int namespc)

{
  bool bVar1;
  int lumpnum_00;
  FTextureID *pFVar2;
  FTextureID local_2c;
  int lumpnum;
  FTextureID picnum;
  int i;
  int OldCount;
  int namespc_local;
  int numPatches_local;
  char **patchNames_local;
  FImageCollection *this_local;
  
  picnum.texnum = TArray<FTextureID,_FTextureID>::Size(&this->ImageMap);
  TArray<FTextureID,_FTextureID>::Resize(&this->ImageMap,picnum.texnum + numPatches);
  for (lumpnum = 0; lumpnum < numPatches; lumpnum = lumpnum + 1) {
    local_2c = FTextureManager::CheckForTexture(&TexMan,patchNames[lumpnum],namespc,1);
    bVar1 = FTextureID::isValid(&local_2c);
    if ((!bVar1) &&
       (lumpnum_00 = FWadCollection::CheckNumForName(&Wads,patchNames[lumpnum],namespc),
       -1 < lumpnum_00)) {
      local_2c = FTextureManager::CreateTexture(&TexMan,lumpnum_00,namespc);
    }
    pFVar2 = TArray<FTextureID,_FTextureID>::operator[]
                       (&this->ImageMap,(long)(picnum.texnum + lumpnum));
    pFVar2->texnum = local_2c.texnum;
  }
  return;
}

Assistant:

void FImageCollection::Add (const char **patchNames, int numPatches, int namespc)
{
	int OldCount = ImageMap.Size();

	ImageMap.Resize(OldCount + numPatches);

	for (int i = 0; i < numPatches; ++i)
	{
		FTextureID picnum = TexMan.CheckForTexture(patchNames[i], namespc);
		if (!picnum.isValid())
		{
			int lumpnum = Wads.CheckNumForName(patchNames[i], namespc);
			if (lumpnum >= 0)
			{
				picnum = TexMan.CreateTexture(lumpnum, namespc);
			}
		}
		ImageMap[OldCount + i] = picnum;
	}
}